

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr64.h
# Opt level: O0

int64_t __thiscall icu_63::UVector64::push(UVector64 *this,int64_t i,UErrorCode *status)

{
  UErrorCode *status_local;
  int64_t i_local;
  UVector64 *this_local;
  
  addElement(this,i,status);
  return i;
}

Assistant:

inline int64_t UVector64::push(int64_t i, UErrorCode &status) {
    addElement(i, status);
    return i;
}